

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int *piVar1;
  ostream *poVar2;
  DeathTestImpl *in_RDI;
  bool bVar3;
  int gtest_retval;
  int bytes_read;
  char flag;
  void *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  ostream *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  string local_158 [4];
  int in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  GTestLogSeverity in_stack_fffffffffffffebc;
  GTestLog *in_stack_fffffffffffffec0;
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [36];
  int local_4c;
  string local_48 [28];
  int in_stack_ffffffffffffffd4;
  undefined1 local_28 [40];
  
  do {
    read_fd(in_RDI);
    local_28._24_4_ = posix::Read(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,0);
    bVar3 = false;
    if (local_28._24_4_ == -1) {
      piVar1 = __errno_location();
      bVar3 = *piVar1 == 4;
    }
  } while (bVar3);
  if (local_28._24_4_ == 0) {
    set_outcome(in_RDI,DIED);
  }
  else if (local_28._24_4_ == 1) {
    switch(local_28[0x1f]) {
    case 0x49:
      read_fd(in_RDI);
      FailFromInternalError(in_stack_ffffffffffffffd4);
      break;
    default:
      in_stack_fffffffffffffe78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_28 + 0x14);
      GTestLog::GTestLog(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      in_stack_fffffffffffffe80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           GTestLog::GetStream((GTestLog *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<((ostream *)in_stack_fffffffffffffe80,"Death test child process reported "
                          );
      in_stack_fffffffffffffe68 =
           std::operator<<((ostream *)in_stack_fffffffffffffe70,"unexpected status byte (");
      poVar2 = (ostream *)
               std::ostream::operator<<(in_stack_fffffffffffffe68,(int)(char)local_28[0x1f]);
      std::operator<<(poVar2,")");
      GTestLog::~GTestLog((GTestLog *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))
      ;
      break;
    case 0x4c:
      set_outcome(in_RDI,LIVED);
      break;
    case 0x52:
      set_outcome(in_RDI,RETURNED);
      break;
    case 0x54:
      set_outcome(in_RDI,THREW);
    }
  }
  else {
    in_stack_fffffffffffffe50 = (string *)local_28;
    GTestLog::GTestLog(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0
                       ,in_stack_fffffffffffffeac);
    poVar2 = GTestLog::GetStream((GTestLog *)in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe48 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<(poVar2,"Read from death test child process failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator<<((ostream *)in_stack_fffffffffffffe48,local_48);
    std::__cxx11::string::~string(local_48);
    GTestLog::~GTestLog((GTestLog *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  do {
    do {
      read_fd(in_RDI);
      local_4c = posix::Close(0);
      in_stack_fffffffffffffe44 = in_stack_fffffffffffffe44 & 0xffffff;
      if (local_4c == -1) {
        piVar1 = __errno_location();
        in_stack_fffffffffffffe44 = CONCAT13(*piVar1 == 4,(int3)in_stack_fffffffffffffe44);
      }
    } while ((char)(in_stack_fffffffffffffe44 >> 0x18) != '\0');
    if (local_4c == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                 (allocator<char> *)in_stack_fffffffffffffe70);
      std::operator+(in_stack_fffffffffffffe48,
                     (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      std::operator+(in_stack_fffffffffffffe48,
                     (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      StreamableToString<int>((int *)in_stack_fffffffffffffe68);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      std::operator+(in_stack_fffffffffffffe48,
                     (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      std::operator+(in_stack_fffffffffffffe48,
                     (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      std::operator+(in_stack_fffffffffffffe48,
                     (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      DeathTestAbort(in_stack_fffffffffffffe50);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator(&local_131);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  set_read_fd(in_RDI,-1);
  return;
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}